

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::IRContext::get_instr_block(IRContext *this,Instruction *instr)

{
  bool bVar1;
  pointer ppVar2;
  BasicBlock *local_38;
  _Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false>
  local_28;
  _Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false>
  local_20;
  iterator entry;
  Instruction *instr_local;
  IRContext *this_local;
  
  entry.
  super__Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false>
             )(_Node_iterator_base<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false>
               )instr;
  bVar1 = AreAnalysesValid(this,kAnalysisInstrToBlockMapping);
  if (!bVar1) {
    BuildInstrToBlockMapping(this);
  }
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
       ::find(&this->instr_to_block_,(key_type *)&entry);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
       ::end(&this->instr_to_block_);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_false,_false>
                           *)&local_20);
    local_38 = ppVar2->second;
  }
  else {
    local_38 = (BasicBlock *)0x0;
  }
  return local_38;
}

Assistant:

BasicBlock* get_instr_block(Instruction* instr) {
    if (!AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
      BuildInstrToBlockMapping();
    }
    auto entry = instr_to_block_.find(instr);
    return (entry != instr_to_block_.end()) ? entry->second : nullptr;
  }